

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::anon_unknown_5::MaximumMatcher::FindArgumentPathDFS
          (MaximumMatcher *this,int v,vector<bool,_std::allocator<bool>_> *visited)

{
  ulong *puVar1;
  int v_00;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (ulong)v;
  uVar6 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar6 = uVar3;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar6 >> 6) +
           (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)v & 0x3f);
  bVar4 = 0 < this->count2_;
  if (0 < this->count2_) {
    lVar5 = 0;
    do {
      if (((this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar5] == -1) &&
         (bVar2 = Match(this,v,(int)lVar5), bVar2)) {
        (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar5] = v;
        if (bVar4) {
          return true;
        }
        break;
      }
      lVar5 = lVar5 + 1;
      bVar4 = lVar5 < this->count2_;
    } while (lVar5 < this->count2_);
  }
  bVar4 = 0 < this->count2_;
  if (0 < this->count2_) {
    lVar5 = 0;
    do {
      v_00 = (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar5];
      uVar6 = (ulong)v_00;
      if ((uVar6 != 0xffffffffffffffff) && (bVar2 = Match(this,v,(int)lVar5), bVar2)) {
        uVar3 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar3 = uVar6;
        }
        if ((((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p
              [((long)uVar3 >> 6) +
               (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
              (uVar6 & 0x3f) & 1) == 0) && (bVar2 = FindArgumentPathDFS(this,v_00,visited), bVar2))
        {
          (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar5] = v;
          return bVar4;
        }
      }
      lVar5 = lVar5 + 1;
      bVar4 = lVar5 < this->count2_;
    } while (lVar5 < this->count2_);
  }
  return bVar4;
}

Assistant:

bool MaximumMatcher::FindArgumentPathDFS(int v, std::vector<bool>* visited) {
  (*visited)[v] = true;
  // We try to match those un-matched nodes on the right side first. This is
  // the step that the naive greedy matching algorithm uses. In the best cases
  // where the greedy algorithm can find a maximum matching, we will always
  // find a match in this step and the performance will be identical to the
  // greedy algorithm.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched == -1 && Match(v, i)) {
      (*match_list2_)[i] = v;
      return true;
    }
  }
  // Then we try those already matched nodes and see if we can find an
  // alternative match for the node matched to them.
  // The greedy algorithm will stop before this and fail to produce the
  // correct result.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched != -1 && Match(v, i)) {
      if (!(*visited)[matched] && FindArgumentPathDFS(matched, visited)) {
        (*match_list2_)[i] = v;
        return true;
      }
    }
  }
  return false;
}